

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void __thiscall cali::Caliper::begin(Caliper *this,Attribute *attr,Variant *data)

{
  bool bVar1;
  uint prop_00;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *pvVar2;
  element_type *peVar3;
  ChannelBody *local_b0;
  Caliper *local_a8;
  __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_a0;
  Channel *channel_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *__range2_1;
  lock_guard<std::mutex> gbb;
  ChannelBody *local_68;
  Caliper *local_60;
  __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_58;
  Channel *channel;
  iterator __end2;
  iterator __begin2;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *__range2;
  lock_guard<(anonymous_namespace)::siglock> g;
  bool run_events;
  int scope;
  int prop;
  Variant *data_local;
  Attribute *attr_local;
  Caliper *this_local;
  
  if ((this->sT->stack_error & 1U) == 0) {
    prop_00 = Attribute::properties(attr);
    g._M_device._7_1_ = ((prop_00 & 0x40) != 0 ^ 0xffU) & 1;
    std::lock_guard<(anonymous_namespace)::siglock>::lock_guard
              ((lock_guard<(anonymous_namespace)::siglock> *)&__range2,&this->sT->lock);
    if ((g._M_device._7_1_ & 1) != 0) {
      pvVar2 = &this->sG->active_channels;
      __end2 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin(pvVar2);
      channel = (Channel *)std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end(pvVar2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                         *)&channel), bVar1) {
        local_58 = (__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                      ::operator*(&__end2);
        peVar3 = std::
                 __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_58);
        local_60 = this;
        local_68 = Channel::body((Channel *)local_58);
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(peVar3->events).pre_begin_evt,&local_60,&local_68,attr,data);
        __gnu_cxx::
        __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
        ::operator++(&__end2);
      }
    }
    if ((prop_00 & 0x3c) == 0x14) {
      anon_unknown.dwarf_30b7b8::handle_begin
                (attr,data,prop_00,&this->sT->thread_blackboard,&this->sT->tree);
    }
    else if ((prop_00 & 0x3c) == 0xc) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&__range2_1,&this->sG->process_blackboard_lock);
      anon_unknown.dwarf_30b7b8::handle_begin
                (attr,data,prop_00,&this->sG->process_blackboard,&this->sT->tree);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2_1);
    }
    if ((g._M_device._7_1_ & 1) != 0) {
      pvVar2 = &this->sG->active_channels;
      __end2_1 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin(pvVar2);
      channel_1 = (Channel *)std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end(pvVar2)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                 *)&channel_1), bVar1) {
        local_a0 = (__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                      ::operator*(&__end2_1);
        peVar3 = std::
                 __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_a0);
        local_a8 = this;
        local_b0 = Channel::body((Channel *)local_a0);
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(peVar3->events).post_begin_evt,&local_a8,&local_b0,attr,data);
        __gnu_cxx::
        __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
        ::operator++(&__end2_1);
      }
    }
    std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard
              ((lock_guard<(anonymous_namespace)::siglock> *)&__range2);
  }
  return;
}

Assistant:

void Caliper::begin(const Attribute& attr, const Variant& data)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    std::lock_guard<::siglock> g(sT->lock);

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_begin_evt(this, channel.body(), attr, data);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_begin(attr, data, prop, sT->thread_blackboard, sT->tree);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_begin(attr, data, prop, sG->process_blackboard, sT->tree);
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.post_begin_evt(this, channel.body(), attr, data);
}